

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

bool __thiscall Minisat::Solver::litRedundant(Solver *this,Lit p)

{
  VMap<char> *this_00;
  vec<Minisat::Solver::ShrinkStackElem,_int> *this_01;
  uint uVar1;
  uint uVar2;
  ShrinkStackElem *pSVar3;
  CRef CVar4;
  char *pcVar5;
  uint *puVar6;
  long lVar7;
  int iVar8;
  int i;
  int x;
  long lVar9;
  uint32_t uVar10;
  Lit p_local;
  ShrinkStackElem local_48;
  vec<Minisat::Lit,_int> *local_40;
  RegionAllocator<unsigned_int> *local_38;
  
  this_00 = &this->seen;
  iVar8 = p.x >> 1;
  p_local = p;
  pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                     (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar8);
  if ((*pcVar5 != '\0') &&
     (pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar8),
     *pcVar5 != '\x01')) {
    __assert_fail("seen[var(p)] == seen_undef || seen[var(p)] == seen_source",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/core/Solver.cc"
                  ,0x187,"bool Minisat::Solver::litRedundant(Lit)");
  }
  CVar4 = reason(this,iVar8);
  if (CVar4 == 0xffffffff) {
    __assert_fail("reason(var(p)) != CRef_Undef",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/core/Solver.cc"
                  ,0x188,"bool Minisat::Solver::litRedundant(Lit)");
  }
  CVar4 = reason(this,iVar8);
  local_38 = &(this->ca).ra;
  puVar6 = RegionAllocator<unsigned_int>::operator[](&(this->ca).ra,CVar4);
  if ((this->analyze_stack).data != (ShrinkStackElem *)0x0) {
    (this->analyze_stack).sz = 0;
  }
  this_01 = &this->analyze_stack;
  local_40 = &this->analyze_toclear;
  uVar10 = 1;
  do {
    uVar1 = *puVar6;
    if (uVar10 < uVar1 >> 5) {
      uVar2 = puVar6[(ulong)uVar10 + 1];
      x = (int)uVar2 >> 1;
      iVar8 = level(this,x);
      if (((iVar8 != 0) &&
          (pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                              (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,x),
          *pcVar5 != '\x01')) &&
         (pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                             (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,x),
         *pcVar5 != '\x02')) {
        CVar4 = reason(this,x);
        if ((CVar4 == 0xffffffff) ||
           (pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                               (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,x),
           *pcVar5 == '\x03')) {
          local_48.i = 0;
          local_48.l.x = p_local.x;
          vec<Minisat::Solver::ShrinkStackElem,_int>::push(this_01,&local_48);
          lVar7 = 4;
          for (lVar9 = 0; lVar9 < (this->analyze_stack).sz; lVar9 = lVar9 + 1) {
            pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                               (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                                *(int *)((long)&this_01->data->i + lVar7) >> 1);
            if (*pcVar5 == '\0') {
              pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                                 (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                                  *(int *)((long)&this_01->data->i + lVar7) >> 1);
              *pcVar5 = '\x03';
              vec<Minisat::Lit,_int>::push(local_40,(Lit *)((long)&this_01->data->i + lVar7));
            }
            lVar7 = lVar7 + 8;
          }
LAB_0010c567:
          return uVar1 >> 5 <= uVar10;
        }
        local_48.l.x = p_local.x;
        local_48.i = uVar10;
        vec<Minisat::Solver::ShrinkStackElem,_int>::push(this_01,&local_48);
        p_local.x = uVar2;
        CVar4 = reason(this,x);
        puVar6 = RegionAllocator<unsigned_int>::operator[](local_38,CVar4);
        uVar10 = 0;
      }
    }
    else {
      pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                          p_local.x >> 1);
      if (*pcVar5 == '\0') {
        pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                           (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                            p_local.x >> 1);
        *pcVar5 = '\x02';
        vec<Minisat::Lit,_int>::push(local_40,&p_local);
      }
      lVar7 = (long)(this->analyze_stack).sz;
      if (lVar7 == 0) goto LAB_0010c567;
      pSVar3 = (this->analyze_stack).data;
      uVar10 = pSVar3[lVar7 + -1].i;
      p_local.x = pSVar3[lVar7 + -1].l.x;
      CVar4 = reason(this,p_local.x >> 1);
      puVar6 = RegionAllocator<unsigned_int>::operator[](local_38,CVar4);
      vec<Minisat::Solver::ShrinkStackElem,_int>::pop(this_01);
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

bool Solver::litRedundant(Lit p)
{
    enum { seen_undef = 0, seen_source = 1, seen_removable = 2, seen_failed = 3 };
    assert(seen[var(p)] == seen_undef || seen[var(p)] == seen_source);
    assert(reason(var(p)) != CRef_Undef);

    Clause*               c     = &ca[reason(var(p))];
    vec<ShrinkStackElem>& stack = analyze_stack;
    stack.clear();

    for (uint32_t i = 1; ; i++){
        if (i < (uint32_t)c->size()){
            // Checking 'p'-parents 'l':
            Lit l = (*c)[i];
            
            // Variable at level 0 or previously removable:
            if (level(var(l)) == 0 || seen[var(l)] == seen_source || seen[var(l)] == seen_removable){
                continue; }
            
            // Check variable can not be removed for some local reason:
            if (reason(var(l)) == CRef_Undef || seen[var(l)] == seen_failed){
                stack.push(ShrinkStackElem(0, p));
                for (int i = 0; i < stack.size(); i++)
                    if (seen[var(stack[i].l)] == seen_undef){
                        seen[var(stack[i].l)] = seen_failed;
                        analyze_toclear.push(stack[i].l);
                    }
                    
                return false;
            }

            // Recursively check 'l':
            stack.push(ShrinkStackElem(i, p));
            i  = 0;
            p  = l;
            c  = &ca[reason(var(p))];
        }else{
            // Finished with current element 'p' and reason 'c':
            if (seen[var(p)] == seen_undef){
                seen[var(p)] = seen_removable;
                analyze_toclear.push(p);
            }

            // Terminate with success if stack is empty:
            if (stack.size() == 0) break;
            
            // Continue with top element on stack:
            i  = stack.last().i;
            p  = stack.last().l;
            c  = &ca[reason(var(p))];

            stack.pop();
        }
    }

    return true;
}